

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::applyDiagnosticPragma
          (Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  size_t sVar1;
  bool bVar2;
  Info *pIVar3;
  SyntaxNode *pSVar4;
  SourceLocation SVar5;
  Diagnostic *this_00;
  PragmaExpressionSyntax *expr;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *pSVar6;
  char *pcVar7;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *pSVar8;
  SourceManager *this_01;
  SyntaxNode *pSVar9;
  string_view sVar10;
  SourceRange SVar11;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  size_t sStack_90;
  DiagnosticSeverity severity;
  Preprocessor *local_68;
  iterator __begin6;
  Token last;
  anon_class_16_2_8b023938 setDirective;
  
  sVar1 = (pragma->args).elements._M_extent._M_extent_value;
  if (sVar1 == 0) {
    last = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)pragma);
    SVar5 = Token::location(&last);
    sVar10 = Token::rawText(&last);
    addDiag(this,(DiagCode)0x1d0004,(SourceLocation)((long)SVar5 + sVar10._M_len * 0x10000000));
  }
  else {
    pSVar8 = &pragma->args;
    last.info = (Info *)0x0;
    last._0_8_ = pSVar8;
    pIVar3 = (Info *)0x0;
    pSVar6 = pSVar8;
    local_68 = this;
    while (pSVar6 != pSVar8 || pIVar3 != (Info *)(sVar1 + 1 >> 1)) {
      pSVar4 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>::dereference
                          ((iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *)&last)->
                super_SyntaxNode;
      if (pSVar4->kind == NameValuePragmaExpression) {
        sVar10 = Token::valueText((Token *)(pSVar4 + 1));
        __y_00._M_str = "ignore";
        __y_00._M_len = 6;
        bVar2 = std::operator==(sVar10,__y_00);
        if (bVar2) {
          severity = Ignored;
        }
        else {
          __y_01._M_str = "warn";
          __y_01._M_len = 4;
          bVar2 = std::operator==(sVar10,__y_01);
          if (bVar2) {
            severity = Warning;
          }
          else {
            __y_03._M_str = "error";
            __y_03._M_len = 5;
            bVar2 = std::operator==(sVar10,__y_03);
            if (bVar2) {
              severity = Error;
            }
            else {
              __y_04._M_str = "fatal";
              __y_04._M_len = 5;
              bVar2 = std::operator==(sVar10,__y_04);
              if (!bVar2) {
                SVar11 = Token::range((Token *)(pSVar4 + 1));
                this = local_68;
                addDiag(local_68,(DiagCode)0x1e0004,SVar11);
                goto LAB_0019e4ab;
              }
              severity = Fatal;
            }
          }
        }
        this = local_68;
        setDirective.this = local_68;
        setDirective.severity = &severity;
        pSVar4 = pSVar4[2].parent;
        if (((SyntaxNode *)&pSVar4->kind)->kind == ParenPragmaExpression) {
          __begin6.index = 0;
          pSVar9 = pSVar4[3].previewNode;
          __begin6.list = (ParentList *)&pSVar4[1].previewNode;
          for (; (__begin6.list != (ParentList *)&pSVar4[1].previewNode ||
                 (__begin6.index != (ulong)((long)&pSVar9->kind + 1) >> 1));
              __begin6.index = __begin6.index + 1) {
            expr = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                   iterator_base<slang::syntax::PragmaExpressionSyntax_*>::dereference(&__begin6);
            applyDiagnosticPragma::anon_class_16_2_8b023938::operator()(&setDirective,expr);
          }
        }
        else {
          applyDiagnosticPragma::anon_class_16_2_8b023938::operator()
                    (&setDirective,(PragmaExpressionSyntax *)pSVar4);
        }
      }
      else if (pSVar4->kind == SimplePragmaExpression) {
        pSVar9 = pSVar4 + 1;
        sVar10 = Token::rawText((Token *)pSVar9);
        if ((short)pSVar4[1].kind == TokenList) {
          __y._M_str = "push";
          __y._M_len = 4;
          bVar2 = std::operator==(sVar10,__y);
          this = local_68;
          if (bVar2) {
            this_01 = local_68->sourceManager;
            SVar5 = Token::location((Token *)pSVar9);
            sStack_90 = 8;
            pcVar7 = "__push__";
          }
          else {
            if (((short)pSVar9->kind != TokenList) ||
               (__y_02._M_str = "pop", __y_02._M_len = 3, bVar2 = std::operator==(sVar10,__y_02),
               this = local_68, !bVar2)) goto LAB_0019e393;
            this_01 = local_68->sourceManager;
            SVar5 = Token::location((Token *)pSVar9);
            sStack_90 = 7;
            pcVar7 = "__pop__";
          }
          sVar10._M_str = pcVar7;
          sVar10._M_len = sStack_90;
          SourceManager::addDiagnosticDirective(this_01,SVar5,sVar10,Ignored);
        }
        else {
LAB_0019e393:
          SVar11 = Token::range((Token *)pSVar9);
          this = local_68;
          this_00 = addDiag(local_68,(DiagCode)0x2a0004,SVar11);
          Diagnostic::operator<<(this_00,sVar10);
        }
      }
      else {
        SVar11 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
        addDiag(this,(DiagCode)0x1d0004,SVar11);
      }
LAB_0019e4ab:
      pIVar3 = (Info *)((long)&(last.info)->rawTextPtr + 1);
      last.info = pIVar3;
      pSVar6 = (SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)last._0_8_;
    }
  }
  return;
}

Assistant:

void Preprocessor::applyDiagnosticPragma(const PragmaDirectiveSyntax& pragma) {
    if (pragma.args.empty()) {
        Token last = pragma.getLastToken();
        addDiag(diag::ExpectedDiagPragmaArg, last.location() + last.rawText().length());
        return;
    }

    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            std::string_view action = simple.value.rawText();
            if (simple.value.kind == TokenKind::Identifier && action == "push") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__push__",
                                                     DiagnosticSeverity::Ignored);
            }
            else if (simple.value.kind == TokenKind::Identifier && action == "pop") {
                sourceManager.addDiagnosticDirective(simple.value.location(), "__pop__",
                                                     DiagnosticSeverity::Ignored);
            }
            else {
                addDiag(diag::UnknownDiagPragmaArg, simple.value.range()) << action;
            }
        }
        else if (arg->kind == SyntaxKind::NameValuePragmaExpression) {
            auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();

            DiagnosticSeverity severity;
            std::string_view text = nvp.name.valueText();
            if (text == "ignore")
                severity = DiagnosticSeverity::Ignored;
            else if (text == "warn")
                severity = DiagnosticSeverity::Warning;
            else if (text == "error")
                severity = DiagnosticSeverity::Error;
            else if (text == "fatal")
                severity = DiagnosticSeverity::Fatal;
            else {
                addDiag(diag::ExpectedDiagPragmaLevel, nvp.name.range());
                continue;
            }

            auto setDirective = [&](const PragmaExpressionSyntax& expr) {
                if (expr.kind == SyntaxKind::SimplePragmaExpression) {
                    auto& simple = expr.as<SimplePragmaExpressionSyntax>();
                    if (simple.value.kind == TokenKind::StringLiteral) {
                        sourceManager.addDiagnosticDirective(simple.value.location(),
                                                             simple.value.valueText(), severity);
                    }
                    else {
                        addDiag(diag::ExpectedDiagPragmaArg, simple.value.range());
                    }
                }
                else {
                    addDiag(diag::ExpectedDiagPragmaArg, expr.sourceRange());
                }
            };

            if (nvp.value->kind == SyntaxKind::ParenPragmaExpression) {
                auto& paren = nvp.value->as<ParenPragmaExpressionSyntax>();
                for (auto value : paren.values)
                    setDirective(*value);
            }
            else {
                setDirective(*nvp.value);
            }
        }
        else {
            addDiag(diag::ExpectedDiagPragmaArg, arg->sourceRange());
        }
    }
}